

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdl_controller.cpp
# Opt level: O2

void __thiscall
r_exec::PrimaryMDLController::abduce_imdl
          (PrimaryMDLController *this,HLPBindingMap *bm,Fact *super_goal,Fact *f_imdl,bool opposite,
          double confidence,Sim *sim)

{
  Goal *this_00;
  Goal *pGVar1;
  Code *actor;
  uint64_t uVar2;
  Fact *this_01;
  _GMonitor *m;
  _Fact *p_Var3;
  ostream *poVar4;
  long *plVar5;
  Sim *s;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  _Fact::set_cfd(&f_imdl->super__Fact,confidence);
  this_00 = (Goal *)operator_new(0x160);
  pGVar1 = _Fact::get_goal(&super_goal->super__Fact);
  actor = Goal::get_actor(pGVar1);
  Goal::Goal(this_00,&f_imdl->super__Fact,actor,1.0);
  s = sim;
  core::P<r_exec::Sim>::operator=(&this_00->sim,sim);
  uVar2 = (*Now)();
  this_01 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)s);
  Fact::Fact(this_01,(Code *)this_00,uVar2,uVar2,1.0,1.0);
  m = (_GMonitor *)operator_new(200);
  pGVar1 = _Fact::get_goal(&super_goal->super__Fact);
  p_Var3 = Goal::get_target(pGVar1);
  uVar2 = _Fact::get_before(p_Var3);
  RMonitor::RMonitor((RMonitor *)m,this,&bm->super_BindingMap,uVar2,sim->thz,this_01,f_imdl);
  PMDLController::add_r_monitor(&this->super_PMDLController,m);
  PMDLController::inject_goal(&this->super_PMDLController,bm,this_01,f_imdl);
  poVar4 = _Mem::Output(MDL_OUT);
  (*Now)();
  r_code::Utils::RelativeTime_abi_cxx11_((ulong)local_50);
  poVar4 = std::operator<<(poVar4,local_50);
  poVar4 = std::operator<<(poVar4," ");
  (*((((this->super_PMDLController).super_MDLController.super_HLPController.super_OController.
       super_Controller.view)->object).object)->_vptr__Object[2])();
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," -> ");
  (**(code **)((long)(this_01->super__Fact).super_LObject.
                     super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
                     super__Object._vptr__Object + 0x10))(this_01);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," goal imdl ");
  plVar5 = (long *)(**(code **)((long)(this_01->super__Fact).super_LObject.
                                      super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                                      super_Code.super__Object._vptr__Object + 0x48))(this_01,0);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x48))(plVar5,0);
  (**(code **)(*plVar5 + 0x10))(plVar5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"[");
  p_Var3 = Goal::get_target(this_00);
  _Fact::get_after(p_Var3);
  r_code::Utils::RelativeTime_abi_cxx11_((ulong)local_70);
  poVar4 = std::operator<<(poVar4,local_70);
  poVar4 = std::operator<<(poVar4,",");
  p_Var3 = Goal::get_target(this_00);
  _Fact::get_before(p_Var3);
  r_code::Utils::RelativeTime_abi_cxx11_((ulong)local_90);
  poVar4 = std::operator<<(poVar4,local_90);
  std::operator<<(poVar4,"[\n");
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void PrimaryMDLController::abduce_imdl(HLPBindingMap *bm, Fact *super_goal, Fact *f_imdl, bool opposite, double confidence, Sim *sim)   // goal is f->g->f->object or f->g->|f->object; called concurrently by redcue() and _GMonitor::update().
{
    f_imdl->set_cfd(confidence);
    Goal *sub_goal = new Goal(f_imdl, super_goal->get_goal()->get_actor(), 1);
    sub_goal->sim = sim;
    uint64_t now = Now();
    Fact *f_sub_goal = new Fact(sub_goal, now, now, 1, 1);
    add_r_monitor(new RMonitor(this, bm, super_goal->get_goal()->get_target()->get_before(), sim->thz, f_sub_goal, f_imdl)); // the monitor will wait until the deadline of the super-goal.
    inject_goal(bm, f_sub_goal, f_imdl);
    OUTPUT(MDL_OUT) << Utils::RelativeTime(Now()) << " " << getObject()->get_oid() << " -> " << f_sub_goal->get_oid() << " goal imdl " << f_sub_goal->get_reference(0)->get_reference(0)->get_oid() << "[" << Utils::RelativeTime(sub_goal->get_target()->get_after()) << "," << Utils::RelativeTime(sub_goal->get_target()->get_before()) << "[\n";
}